

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O1

int __thiscall stk::FileRead::open(FileRead *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  FILE *pFVar3;
  ostream *poVar4;
  undefined7 extraout_var;
  size_t sVar5;
  undefined8 extraout_RAX;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 extraout_var_03;
  undefined7 uVar6;
  uint in_ECX;
  long lVar7;
  char *pcVar8;
  StkFormat in_R8;
  StkFloat in_XMM0_Qa;
  char header [12];
  int local_44 [2];
  int local_3c;
  StkFloat local_38;
  
  local_38 = in_XMM0_Qa;
  if ((FILE *)this->fd_ != (FILE *)0x0) {
    fclose((FILE *)this->fd_);
  }
  this->fd_ = (FILE *)0x0;
  this->wavFile_ = false;
  this->fileSize_ = 0;
  this->channels_ = 0;
  this->dataType_ = 0;
  this->fileRate_ = 0.0;
  pFVar3 = fopen(*(char **)__file,"rb");
  this->fd_ = (FILE *)pFVar3;
  if (pFVar3 == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead::open: could not open or find file (",
               0x2d);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&Stk::oStream__abi_cxx11_,*(char **)__file,*(long *)(__file + 8))
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")!",2);
    Stk::handleError(&this->super_Stk,FILE_NOT_FOUND);
  }
  if ((char)__oflag == '\0') {
    sVar5 = fread(local_44,4,3,(FILE *)this->fd_);
    if (sVar5 == 3) {
      if ((local_44[0] == 0x46464952) && (local_3c == 0x45564157)) {
        bVar1 = getWavInfo(this,*(char **)__file);
        uVar6 = extraout_var_02;
      }
      else if (local_44[0] == 0x646e732e) {
        bVar1 = getSndInfo(this,*(char **)__file);
        uVar6 = extraout_var_00;
      }
      else if ((local_44[0] == 0x4d524f46) && ((local_3c == 0x46464941 || (local_3c == 0x43464941)))
              ) {
        bVar1 = getAifInfo(this,*(char **)__file);
        uVar6 = extraout_var_01;
      }
      else {
        iVar2 = fseek((FILE *)this->fd_,0x7e,0);
        if ((iVar2 == -1) || (sVar5 = fread(local_44,2,1,(FILE *)this->fd_), sVar5 != 1))
        goto LAB_0010ca1f;
        if (((short)local_44[0] != 0x494d) && ((short)local_44[0] != 0x4d49)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead::open: file (",0x16);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&Stk::oStream__abi_cxx11_,*(char **)__file,
                              *(long *)(__file + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,") format unknown.",0x11);
          Stk::handleError(&this->super_Stk,FILE_UNKNOWN_FORMAT);
          iVar2 = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
          bVar1 = false;
          goto LAB_0010ca71;
        }
        bVar1 = getMatInfo(this,*(char **)__file);
        uVar6 = extraout_var_03;
      }
      iVar2 = (int)CONCAT71(uVar6,1);
    }
    else {
LAB_0010ca1f:
      bVar1 = false;
      iVar2 = 0;
    }
LAB_0010ca71:
    if ((char)iVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead::open: error reading file (",0x24);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&Stk::oStream__abi_cxx11_,*(char **)__file,
                          *(long *)(__file + 8));
      pcVar8 = ")!";
      lVar7 = 2;
      goto LAB_0010cb0b;
    }
  }
  else {
    bVar1 = getRawInfo(this,*(char **)__file,in_ECX,in_R8,local_38);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  if (bVar1 == false) {
    Stk::handleError(&this->super_Stk,FILE_ERROR);
    iVar2 = extraout_EAX;
  }
  if (this->fileSize_ != 0) {
    return iVar2;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&Stk::oStream__abi_cxx11_,"FileRead::open: file (",0x16);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&Stk::oStream__abi_cxx11_,*(char **)__file,*(long *)(__file + 8));
  pcVar8 = ") data size is zero!";
  lVar7 = 0x14;
LAB_0010cb0b:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,lVar7);
  Stk::handleError(&this->super_Stk,FILE_ERROR);
  return extraout_EAX_00;
}

Assistant:

void FileRead :: open( std::string fileName, bool typeRaw, unsigned int nChannels,
                       StkFormat format, StkFloat rate )
{
  // If another file is open, close it.
  close();

  // Try to open the file.
  fd_ = fopen( fileName.c_str(), "rb" );
  if ( !fd_ ) {
    oStream_ << "FileRead::open: could not open or find file (" << fileName << ")!";
    handleError( StkError::FILE_NOT_FOUND );
  }

  // Attempt to determine file type from header (unless RAW).
  bool result = false;
  if ( typeRaw )
    result = getRawInfo( fileName.c_str(), nChannels, format, rate );
  else {
    char header[12];
    if ( fread( &header, 4, 3, fd_ ) != 3 ) goto error;
    if ( !strncmp( header, "RIFF", 4 ) &&
         !strncmp( &header[8], "WAVE", 4 ) )
      result = getWavInfo( fileName.c_str() );
    else if ( !strncmp( header, ".snd", 4 ) )
      result = getSndInfo( fileName.c_str() );
    else if ( !strncmp( header, "FORM", 4 ) &&
              ( !strncmp( &header[8], "AIFF", 4 ) || !strncmp(&header[8], "AIFC", 4) ) )
      result = getAifInfo( fileName.c_str() );
    else {
      if ( fseek( fd_, 126, SEEK_SET ) == -1 ) goto error;
      if ( fread( &header, 2, 1, fd_ ) != 1 ) goto error;
      if ( !strncmp( header, "MI", 2 ) ||
           !strncmp( header, "IM", 2 ) )
        result = getMatInfo( fileName.c_str() );
      else {
        oStream_ << "FileRead::open: file (" << fileName << ") format unknown.";
        handleError( StkError::FILE_UNKNOWN_FORMAT );
      }
    }
  }

  // If here, we had a file type candidate but something else went wrong.
  if ( result == false )
    handleError( StkError::FILE_ERROR );

  // Check for empty files.
  if ( fileSize_ == 0 ) {
    oStream_ << "FileRead::open: file (" << fileName << ") data size is zero!";
    handleError( StkError::FILE_ERROR );
  }

  return;

 error:
  oStream_ << "FileRead::open: error reading file (" << fileName << ")!";
  handleError( StkError::FILE_ERROR );
}